

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_slic_marker.cpp
# Opt level: O0

void __thiscall ms_slic_marker_t::~ms_slic_marker_t(ms_slic_marker_t *this)

{
  ms_slic_marker_t *this_local;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__ms_slic_marker_t_00229040;
  _clean_up(this);
  std::__cxx11::string::~string((string *)&this->m_signature);
  std::__cxx11::string::~string((string *)&this->m_reserved);
  std::__cxx11::string::~string((string *)&this->m_oem_table_id);
  std::__cxx11::string::~string((string *)&this->m_oem_id);
  kaitai::kstruct::~kstruct(&this->super_kstruct);
  return;
}

Assistant:

ms_slic_marker_t::~ms_slic_marker_t() {
    _clean_up();
}